

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceMesh::buildEdgeInfoGui(SurfaceMesh *this,size_t eInd)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  iterator id;
  iterator iVar4;
  pointer pSVar5;
  value_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>
  *x;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
  *__range1;
  size_t displayInd;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
  *this_00;
  char *in_stack_ffffffffffffff78;
  _Self in_stack_ffffffffffffff80;
  _Self in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  unsigned_long in_stack_ffffffffffffffa8;
  string local_38 [32];
  value_type local_18;
  size_type local_10;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RSI;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&in_RDI[0x96].field_2 + 8));
  if (sVar2 != 0) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&in_RDI[0x96].field_2 + 8),local_10);
    local_18 = *pvVar3;
  }
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
             *)&stack0xffffffffffffffa8;
  std::__cxx11::to_string(in_stack_ffffffffffffffa8);
  std::operator+(in_stack_ffffffffffffff78,in_RDI);
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted((char *)in_RDI,(char *)this_00);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent((float)((ulong)in_stack_ffffffffffffff80._M_node >> 0x20));
  ImGui::Columns(iVar7,(char *)in_stack_ffffffffffffff88._M_node,
                 SUB81((ulong)in_stack_ffffffffffffff80._M_node >> 0x38,0));
  ImGui::GetWindowWidth();
  ImGui::SetColumnWidth
            ((int)((ulong)in_stack_ffffffffffffff80._M_node >> 0x20),
             SUB84(in_stack_ffffffffffffff80._M_node,0));
  pbVar6 = in_RDI + 0x1e;
  id = std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
       ::begin(this_00);
  iVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff88,(_Self *)&stack0xffffffffffffff80);
    iVar7 = (int)((ulong)pbVar6 >> 0x20);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
                 *)0x473e67);
    pSVar5 = std::
             unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>
             ::operator->((unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>
                           *)0x473e7a);
    (*(pSVar5->super_QuantityS<polyscope::SurfaceMesh>).super_Quantity._vptr_Quantity[0xc])
              (pSVar5,local_10);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
                  *)in_RDI);
  }
  ImGui::Indent((float)((ulong)iVar4._M_node >> 0x20));
  ImGui::Columns(iVar7,(char *)id._M_node,SUB81((ulong)iVar4._M_node >> 0x38,0));
  return;
}

Assistant:

void SurfaceMesh::buildEdgeInfoGui(size_t eInd) {
  size_t displayInd = eInd;
  if (edgePerm.size() > 0) {
    displayInd = edgePerm[eInd];
  }
  ImGui::TextUnformatted(("Edge #" + std::to_string(displayInd)).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildEdgeInfoGUI(eInd);
  }

  ImGui::Indent(-20.);
  ImGui::Columns(1);
}